

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unpack.c
# Opt level: O2

exr_result_t generic_unpack_deep_pointers(exr_decode_pipeline_t *decode)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  exr_coding_channel_info_t *peVar4;
  uint16_t uVar5;
  float fVar6;
  int x;
  int iVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  uint8_t *puVar11;
  uint8_t *cdata;
  float *pfVar12;
  long lVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  int iVar20;
  void *pvVar21;
  int32_t *local_b0;
  
  pvVar21 = decode->unpacked_buffer;
  uVar2 = (decode->chunk).width;
  uVar8 = (decode->chunk).height - decode->user_line_end_ignore;
  uVar14 = 0;
  if (0 < (int)uVar2) {
    uVar14 = (ulong)uVar2;
  }
  local_b0 = decode->sample_count_table;
  uVar10 = (ulong)uVar8;
  if ((int)uVar8 < 1) {
    uVar10 = 0;
  }
  iVar3 = decode->user_line_begin_skip;
  uVar16 = 0;
  do {
    if (uVar16 == uVar10) {
      return 0;
    }
    for (lVar17 = 0; lVar17 < decode->channel_count; lVar17 = lVar17 + 1) {
      peVar4 = decode->channels;
      cVar1 = peVar4[lVar17].bytes_per_element;
      if (((long)uVar16 < (long)iVar3) || (peVar4[lVar17].field_12.decode_to_ptr == (uint8_t *)0x0))
      {
        if ((decode->decode_flags & 1) == 0) {
          iVar9 = local_b0[(long)(int)uVar2 + -1];
        }
        else {
          iVar9 = 0;
          for (uVar15 = 0; uVar14 != uVar15; uVar15 = uVar15 + 1) {
            iVar9 = iVar9 + local_b0[uVar15];
          }
        }
        pvVar21 = (void *)((long)pvVar21 + (long)iVar9 * (long)cVar1);
      }
      else {
        lVar19 = (long)peVar4[lVar17].user_bytes_per_element;
        puVar11 = peVar4[lVar17].field_12.decode_to_ptr +
                  ((ulong)(long)peVar4[lVar17].user_line_stride >> 3) * (uVar16 - (long)iVar3) * 8;
        iVar9 = peVar4[lVar17].user_pixel_stride;
        iVar7 = 0;
        for (uVar15 = 0; uVar15 != uVar14; uVar15 = uVar15 + 1) {
          pfVar12 = *(float **)puVar11;
          iVar20 = iVar7;
          iVar18 = local_b0[uVar15];
          if ((decode->decode_flags & 1) != 0) {
            iVar20 = 0;
            iVar18 = iVar7;
          }
          iVar7 = iVar18;
          iVar20 = local_b0[uVar15] - iVar20;
          if (pfVar12 != (float *)0x0) {
            uVar5 = peVar4[lVar17].data_type;
            if (uVar5 == 0) {
              uVar5 = peVar4[lVar17].user_data_type;
              if (uVar5 == 2) {
                iVar18 = 0;
                if (0 < iVar20) {
                  iVar18 = iVar20;
                }
                for (lVar13 = 0; iVar18 != (int)lVar13; lVar13 = lVar13 + 1) {
                  *pfVar12 = (float)*(uint *)((long)pvVar21 + lVar13 * 4);
                  pfVar12 = (float *)((long)pfVar12 + lVar19);
                }
              }
              else if (uVar5 == 1) {
                iVar18 = 0;
                if (0 < iVar20) {
                  iVar18 = iVar20;
                }
                for (lVar13 = 0; iVar18 != (int)lVar13; lVar13 = lVar13 + 1) {
                  uVar5 = uint_to_half(*(uint32_t *)((long)pvVar21 + lVar13 * 4));
                  *(uint16_t *)pfVar12 = uVar5;
                  pfVar12 = (float *)((long)pfVar12 + lVar19);
                }
              }
              else {
                if (uVar5 != 0) {
                  return 3;
                }
                iVar18 = 0;
                if (0 < iVar20) {
                  iVar18 = iVar20;
                }
                for (lVar13 = 0; iVar18 != (int)lVar13; lVar13 = lVar13 + 1) {
                  *pfVar12 = *(float *)((long)pvVar21 + lVar13 * 4);
                  pfVar12 = (float *)((long)pfVar12 + lVar19);
                }
              }
            }
            else if (uVar5 == 2) {
              uVar5 = peVar4[lVar17].user_data_type;
              if (uVar5 == 2) {
                iVar18 = 0;
                if (0 < iVar20) {
                  iVar18 = iVar20;
                }
                for (lVar13 = 0; iVar18 != (int)lVar13; lVar13 = lVar13 + 1) {
                  *pfVar12 = *(float *)((long)pvVar21 + lVar13 * 4);
                  pfVar12 = (float *)((long)pfVar12 + lVar19);
                }
              }
              else if (uVar5 == 1) {
                iVar18 = 0;
                if (0 < iVar20) {
                  iVar18 = iVar20;
                }
                for (lVar13 = 0; iVar18 != (int)lVar13; lVar13 = lVar13 + 1) {
                  uVar5 = float_to_half(*(float *)((long)pvVar21 + lVar13 * 4));
                  *(uint16_t *)pfVar12 = uVar5;
                  pfVar12 = (float *)((long)pfVar12 + lVar19);
                }
              }
              else {
                if (uVar5 != 0) {
                  return 3;
                }
                iVar18 = 0;
                if (0 < iVar20) {
                  iVar18 = iVar20;
                }
                for (lVar13 = 0; iVar18 != (int)lVar13; lVar13 = lVar13 + 1) {
                  fVar6 = (float)float_to_uint_int(*(uint32_t *)((long)pvVar21 + lVar13 * 4));
                  *pfVar12 = fVar6;
                  pfVar12 = (float *)((long)pfVar12 + lVar19);
                }
              }
            }
            else {
              if (uVar5 != 1) {
                return 3;
              }
              uVar5 = peVar4[lVar17].user_data_type;
              if (uVar5 == 2) {
                iVar18 = 0;
                if (0 < iVar20) {
                  iVar18 = iVar20;
                }
                for (lVar13 = 0; iVar18 != (int)lVar13; lVar13 = lVar13 + 1) {
                  fVar6 = half_to_float(*(uint16_t *)((long)pvVar21 + lVar13 * 2));
                  *pfVar12 = fVar6;
                  pfVar12 = (float *)((long)pfVar12 + lVar19);
                }
              }
              else if (uVar5 == 1) {
                iVar18 = 0;
                if (0 < iVar20) {
                  iVar18 = iVar20;
                }
                for (lVar13 = 0; iVar18 != (int)lVar13; lVar13 = lVar13 + 1) {
                  *(uint16_t *)pfVar12 = *(uint16_t *)((long)pvVar21 + lVar13 * 2);
                  pfVar12 = (float *)((long)pfVar12 + lVar19);
                }
              }
              else {
                if (uVar5 != 0) {
                  return 3;
                }
                iVar18 = 0;
                if (0 < iVar20) {
                  iVar18 = iVar20;
                }
                for (lVar13 = 0; iVar18 != (int)lVar13; lVar13 = lVar13 + 1) {
                  fVar6 = (float)half_to_uint(*(uint16_t *)((long)pvVar21 + lVar13 * 2));
                  *pfVar12 = fVar6;
                  pfVar12 = (float *)((long)pfVar12 + lVar19);
                }
              }
            }
          }
          puVar11 = puVar11 + ((long)iVar9 & 0xfffffffffffffff8);
          pvVar21 = (void *)((long)pvVar21 + (long)iVar20 * (long)cVar1);
        }
      }
    }
    local_b0 = local_b0 + (int)uVar2;
    uVar16 = uVar16 + 1;
  } while( true );
}

Assistant:

static exr_result_t
generic_unpack_deep_pointers (exr_decode_pipeline_t* decode)
{
    const uint8_t* srcbuffer  = decode->unpacked_buffer;
    const int32_t* sampbuffer = decode->sample_count_table;
    void**         pdata;
    int            w, h, bpc, ubpc, uls;

    w   = decode->chunk.width;
    h   = decode->chunk.height - decode->user_line_end_ignore;
    /* for user line skip, we use y in the loop so account for that */
    uls = decode->user_line_begin_skip;
    for (int y = 0; y < h; ++y)
    {
        for (int c = 0; c < decode->channel_count; ++c)
        {
            exr_coding_channel_info_t* decc      = (decode->channels + c);
            int32_t                    prevsamps = 0;
            size_t                     pixstride;
            bpc   = decc->bytes_per_element;
            ubpc  = decc->user_bytes_per_element;
            pdata = (void**) decc->decode_to_ptr;

            if (y < uls || !pdata)
            {
                prevsamps = 0;
                if ((decode->decode_flags &
                     EXR_DECODE_SAMPLE_COUNTS_AS_INDIVIDUAL))
                {
                    for (int x = 0; x < w; ++x)
                        prevsamps += sampbuffer[x];
                }
                else
                    prevsamps = sampbuffer[w - 1];
                srcbuffer += ((size_t) bpc) * ((size_t) prevsamps);
                continue;
            }

            pdata += ((size_t) y - uls) *
                     (((size_t) decc->user_line_stride) / sizeof (void*));
            pixstride = ((size_t) decc->user_pixel_stride) / sizeof (void*);

            for (int x = 0; x < w; ++x)
            {
                void*   outpix = *pdata;
                int32_t samps  = sampbuffer[x];
                if (0 == (decode->decode_flags &
                          EXR_DECODE_SAMPLE_COUNTS_AS_INDIVIDUAL))
                {
                    int32_t tmp = samps - prevsamps;
                    prevsamps   = samps;
                    samps       = tmp;
                }

                pdata += pixstride;
                if (outpix)
                {
                    uint8_t* cdata = outpix;

                    UNPACK_SAMPLES (samps)
                }
                srcbuffer += ((size_t) bpc) * ((size_t) samps);
            }
        }
        sampbuffer += w;
    }
    return EXR_ERR_SUCCESS;
}